

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::InitializePrototypes(JavascriptLibrary *this)

{
  Type *addr;
  Type *addr_00;
  Type *pTVar1;
  Type *pTVar2;
  Type *pTVar3;
  ScriptContext *pSVar4;
  bool bVar5;
  Type *type;
  Recycler *pRVar6;
  RecyclableObject *this_00;
  TypePath *pTVar7;
  DynamicType *pDVar8;
  ObjectPrototypeObject *pOVar9;
  DynamicObject *pDVar10;
  JavascriptArray *pJVar11;
  JavascriptBooleanObject *this_01;
  JavascriptNumberObject *this_02;
  JavascriptBigIntObject *this_03;
  JavascriptStringObject *this_04;
  JavascriptDate *this_05;
  JavascriptError *pJVar12;
  Recycler *pRVar13;
  JavascriptFunction *this_06;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  pRVar13 = this->recycler;
  type = &StaticType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Null,
                          (RecyclableObject *)0x0,(JavascriptMethod)0x0)->super_Type;
  local_60 = (undefined1  [8])&RecyclableObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0xad;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
  this_00 = (RecyclableObject *)new<Memory::Recycler>(0x10,pRVar6,0x38bbb2);
  RecyclableObject::RecyclableObject(this_00,type);
  addr = &(this->super_JavascriptLibraryBase).nullValue;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_JavascriptLibraryBase).nullValue.ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  Js::Type::SetHasSpecialPrototype
            ((((this->super_JavascriptLibraryBase).nullValue.ptr)->type).ptr,true);
  pTVar7 = TypePath::New(pRVar13,0x10);
  Memory::Recycler::WBSetBit((char *)&this->rootPath);
  (this->rootPath).ptr = pTVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->rootPath);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (this->super_JavascriptLibraryBase).nullValue.ptr,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeObjectPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pOVar9 = ObjectPrototypeObject::New(pRVar13,pDVar8);
  addr_00 = &(this->super_JavascriptLibraryBase).objectPrototype;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->super_JavascriptLibraryBase).objectPrototype.ptr = pOVar9;
  data._32_8_ = addr_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)SharedPrototypeTypeHandler,
                            true,true);
  Memory::Recycler::WBSetBit((char *)&this->constructorPrototypeObjectType);
  (this->constructorPrototypeObjectType).ptr = pDVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->constructorPrototypeObjectType);
  DynamicType::SetHasNoEnumerableProperties((this->constructorPrototypeObjectType).ptr,true);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayBufferPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).arrayBufferPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).arrayBufferPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ESSharedArrayBuffer == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&this->sharedArrayBufferPrototype);
    (this->sharedArrayBufferPrototype).ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->sharedArrayBufferPrototype);
  }
  else {
    (this->sharedArrayBufferPrototype).ptr = (DynamicObject *)0x0;
  }
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDataViewPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).dataViewPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).dataViewPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypedArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).typedArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).typedArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt8ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Int8ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Int8ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Uint8ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Uint8ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ClampedArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Uint8ClampedArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Uint8ClampedArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt16ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Int16ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Int16ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint16ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Uint16ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Uint16ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Int32ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Int32ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Uint32ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Uint32ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Float32ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Float32ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Float64ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Float64ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Int64ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Int64ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).Uint64ArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).Uint64ArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBoolArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).BoolArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).BoolArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeCharArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).CharArrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).CharArrayPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Array,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pJVar11 = JavascriptArray::New<void*,Js::JavascriptArray,0u>(0,pDVar8,pRVar13);
  pTVar1 = &(this->super_JavascriptLibraryBase).arrayPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).arrayPrototype.ptr = (DynamicObject *)pJVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,
                            TypeIds_BooleanObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBooleanPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptBooleanObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x10d;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
  this_01 = (JavascriptBooleanObject *)new<Memory::Recycler>(0x28,pRVar6,0x38bbb2);
  JavascriptBooleanObject::JavascriptBooleanObject(this_01,(JavascriptBoolean *)0x0,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).booleanPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).booleanPrototype.ptr = (DynamicObject *)this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,
                            TypeIds_NumberObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeNumberPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptNumberObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x111;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
  this_02 = (JavascriptNumberObject *)new<Memory::Recycler>(0x28,pRVar6,0x38bbb2);
  JavascriptNumberObject::JavascriptNumberObject(this_02,&DAT_1000000000000,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).numberPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).numberPrototype.ptr = (DynamicObject *)this_02;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  (this->super_JavascriptLibraryBase).bigintPrototype.ptr = (DynamicObject *)0x0;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ESBigInt == true) {
    pTVar1 = &(this->super_JavascriptLibraryBase).bigintPrototype;
    pDVar8 = DynamicType::New(pSVar4,TypeIds_BigIntObject,*(RecyclableObject **)data._32_8_,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBigIntPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptBigIntObject::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x118;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
    this_03 = (JavascriptBigIntObject *)new<Memory::Recycler>(0x28,pRVar6,0x38bbb2);
    JavascriptBigIntObject::JavascriptBigIntObject(this_03,(JavascriptBigInt *)0x0,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar1);
    pTVar1->ptr = (DynamicObject *)this_03;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  }
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,
                            TypeIds_StringObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptStringObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x11d;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
  this_04 = (JavascriptStringObject *)new<Memory::Recycler>(0x28,pRVar6,0x38bbb2);
  JavascriptStringObject::JavascriptStringObject(this_04,(JavascriptString *)0x0,pDVar8);
  pTVar1 = &(this->super_JavascriptLibraryBase).stringPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).stringPrototype.ptr = (DynamicObject *)this_04;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar1 = &(this->super_JavascriptLibraryBase).datePrototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).datePrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRegexPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar1 = &(this->super_JavascriptLibraryBase).regexPrototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).regexPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).errorPrototype);
    (this->super_JavascriptLibraryBase).errorPrototype.ptr = pDVar10;
  }
  else {
    data._32_8_ = NAN;
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Date,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptDate::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x133;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_60);
    this_05 = (JavascriptDate *)new<Memory::Recycler>(0x80,pRVar6,0x572640);
    JavascriptDate::JavascriptDate(this_05,(double)data._32_8_,pDVar8);
    pTVar1 = &(this->super_JavascriptLibraryBase).datePrototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).datePrototype.ptr = (DynamicObject *)this_05;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Error,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x137;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).errorPrototype);
    (this->super_JavascriptLibraryBase).errorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).errorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar1 = &(this->super_JavascriptLibraryBase).evalErrorPrototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).evalErrorPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x148;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    pTVar1 = &(this->super_JavascriptLibraryBase).evalErrorPrototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).evalErrorPrototype.ptr = (DynamicObject *)pJVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  }
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).rangeErrorPrototype);
    (this->super_JavascriptLibraryBase).rangeErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x149;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).rangeErrorPrototype);
    (this->super_JavascriptLibraryBase).rangeErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).rangeErrorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).referenceErrorPrototype)
    ;
    (this->super_JavascriptLibraryBase).referenceErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x14a;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).referenceErrorPrototype)
    ;
    (this->super_JavascriptLibraryBase).referenceErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).referenceErrorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).syntaxErrorPrototype);
    (this->super_JavascriptLibraryBase).syntaxErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x14b;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).syntaxErrorPrototype);
    (this->super_JavascriptLibraryBase).syntaxErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).syntaxErrorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).typeErrorPrototype);
    (this->super_JavascriptLibraryBase).typeErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x14c;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).typeErrorPrototype);
    (this->super_JavascriptLibraryBase).typeErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).typeErrorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).uriErrorPrototype);
    (this->super_JavascriptLibraryBase).uriErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x14d;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).uriErrorPrototype);
    (this->super_JavascriptLibraryBase).uriErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).uriErrorPrototype);
  pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).aggregateErrorPrototype)
    ;
    (this->super_JavascriptLibraryBase).aggregateErrorPrototype.ptr = pDVar10;
  }
  else {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x14e;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
    JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
    Memory::Recycler::WBSetBit((char *)&(this->super_JavascriptLibraryBase).aggregateErrorPrototype)
    ;
    (this->super_JavascriptLibraryBase).aggregateErrorPrototype.ptr = (DynamicObject *)pJVar12;
  }
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&(this->super_JavascriptLibraryBase).aggregateErrorPrototype);
  if (DAT_015aa2db == '\x01') {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,WasmPhase);
    if (!bVar5) {
      pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
      pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        pDVar10 = DynamicObject::New(pRVar13,pDVar8);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyCompileErrorPrototype);
        (this->webAssemblyCompileErrorPrototype).ptr = pDVar10;
      }
      else {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        local_60 = (undefined1  [8])&JavascriptError::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_766a001;
        data.filename._0_4_ = 0x153;
        pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
        pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
        JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyCompileErrorPrototype);
        (this->webAssemblyCompileErrorPrototype).ptr = (DynamicObject *)pJVar12;
      }
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyCompileErrorPrototype);
      pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
      pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        pDVar10 = DynamicObject::New(pRVar13,pDVar8);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyRuntimeErrorPrototype);
        (this->webAssemblyRuntimeErrorPrototype).ptr = pDVar10;
      }
      else {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        local_60 = (undefined1  [8])&JavascriptError::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_766a001;
        data.filename._0_4_ = 0x154;
        pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
        pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
        JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyRuntimeErrorPrototype);
        (this->webAssemblyRuntimeErrorPrototype).ptr = (DynamicObject *)pJVar12;
      }
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyRuntimeErrorPrototype);
      pDVar10 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
      pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((pSVar4->config).threadConfig)->m_ES6PrototypeChain == true) {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        pDVar10 = DynamicObject::New(pRVar13,pDVar8);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyLinkErrorPrototype);
        (this->webAssemblyLinkErrorPrototype).ptr = pDVar10;
      }
      else {
        pDVar8 = DynamicType::New(pSVar4,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                  (JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)
                                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                   ::defaultInstance,false,false);
        local_60 = (undefined1  [8])&JavascriptError::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_766a001;
        data.filename._0_4_ = 0x155;
        pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
        pJVar12 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar6,0x38bbb2);
        JavascriptError::JavascriptError(pJVar12,pDVar8,0,1);
        Memory::Recycler::WBSetBit((char *)&this->webAssemblyLinkErrorPrototype);
        (this->webAssemblyLinkErrorPrototype).ptr = (DynamicObject *)pJVar12;
      }
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyLinkErrorPrototype);
    }
  }
  data._32_8_ = pRVar13;
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            JavascriptFunction::PrototypeEntryPoint,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x15d;
  pRVar13 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
  this_06 = (JavascriptFunction *)new<Memory::Recycler>(0x30,pRVar13,0x38bbb2);
  JavascriptFunction::JavascriptFunction
            (this_06,pDVar8,(FunctionInfo *)JavascriptFunction::EntryInfo::PrototypeEntryPoint);
  pTVar1 = &(this->super_JavascriptLibraryBase).functionPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->super_JavascriptLibraryBase).functionPrototype.ptr = (DynamicObject *)this_06;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  (this->super_JavascriptLibraryBase).asyncGeneratorPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).generatorPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).asyncFunctionPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).promisePrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr = (DynamicObject *)0x0;
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSymbolPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New((Recycler *)data._32_8_,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).symbolPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).symbolPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New((Recycler *)data._32_8_,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).mapPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).mapPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New((Recycler *)data._32_8_,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).setPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).setPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakMapPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New((Recycler *)data._32_8_,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).weakMapPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).weakMapPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pRVar13 = (Recycler *)data._32_8_;
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakSetPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).weakSetPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).weakSetPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES2018AsyncIteration == true) {
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar2 = &(this->super_JavascriptLibraryBase).asyncIteratorPrototype;
    Memory::Recycler::WBSetBit((char *)pTVar2);
    (this->super_JavascriptLibraryBase).asyncIteratorPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  }
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar2 = &(this->super_JavascriptLibraryBase).iteratorPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).iteratorPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  bVar5 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr);
  if (!bVar5) {
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar2 = &(this->super_JavascriptLibraryBase).arrayIteratorPrototype;
    Memory::Recycler::WBSetBit((char *)pTVar2);
    (this->super_JavascriptLibraryBase).arrayIteratorPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  }
  pTVar2 = &(this->super_JavascriptLibraryBase).promisePrototype;
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar3 = &(this->super_JavascriptLibraryBase).mapIteratorPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar3);
  (this->super_JavascriptLibraryBase).mapIteratorPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar3);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar3 = &(this->super_JavascriptLibraryBase).setIteratorPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar3);
  (this->super_JavascriptLibraryBase).setIteratorPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar3);
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  pTVar3 = &(this->super_JavascriptLibraryBase).stringIteratorPrototype;
  Memory::Recycler::WBSetBit((char *)pTVar3);
  (this->super_JavascriptLibraryBase).stringIteratorPrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar3);
  if (DAT_015aa2db == '\x01') {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,WasmPhase);
    if (!bVar5) {
      pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object
                                ,(RecyclableObject *)
                                 (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                 ::defaultInstance,false,false);
      pDVar10 = DynamicObject::New(pRVar13,pDVar8);
      Memory::Recycler::WBSetBit((char *)&this->webAssemblyMemoryPrototype);
      (this->webAssemblyMemoryPrototype).ptr = pDVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyMemoryPrototype);
      pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object
                                ,(RecyclableObject *)
                                 (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                 ::defaultInstance,false,false);
      pDVar10 = DynamicObject::New(pRVar13,pDVar8);
      Memory::Recycler::WBSetBit((char *)&this->webAssemblyModulePrototype);
      (this->webAssemblyModulePrototype).ptr = pDVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyModulePrototype);
      pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object
                                ,(RecyclableObject *)
                                 (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyInstancePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                 ::defaultInstance,false,false);
      pDVar10 = DynamicObject::New(pRVar13,pDVar8);
      Memory::Recycler::WBSetBit((char *)&this->webAssemblyInstancePrototype);
      (this->webAssemblyInstancePrototype).ptr = pDVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyInstancePrototype);
      pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object
                                ,(RecyclableObject *)
                                 (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                 ::defaultInstance,false,false);
      pDVar10 = DynamicObject::New(pRVar13,pDVar8);
      Memory::Recycler::WBSetBit((char *)&this->webAssemblyTablePrototype);
      (this->webAssemblyTablePrototype).ptr = pDVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyTablePrototype);
    }
  }
  pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&Js::JavascriptLibrary::InitializePromisePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
  pDVar10 = DynamicObject::New(pRVar13,pDVar8);
  Memory::Recycler::WBSetBit((char *)pTVar2);
  (this->super_JavascriptLibraryBase).promisePrototype.ptr = pDVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES6Generators == true) {
    pTVar2 = &(this->super_JavascriptLibraryBase).generatorFunctionPrototype;
    pTVar3 = &(this->super_JavascriptLibraryBase).generatorPrototype;
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New((Recycler *)data._32_8_,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar2);
    pRVar13 = (Recycler *)data._32_8_;
    (this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar3);
    (this->super_JavascriptLibraryBase).generatorPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar3);
  }
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES7AsyncAwait == true) {
    pTVar2 = &(this->super_JavascriptLibraryBase).asyncFunctionPrototype;
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,&pTVar1->ptr->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar2);
    pTVar2->ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
  }
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar4->config).threadConfig)->m_ES2018AsyncIteration == true) {
    pTVar1 = &(this->super_JavascriptLibraryBase).asyncGeneratorPrototype;
    pTVar2 = &(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype;
    pDVar8 = DynamicType::New(pSVar4,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar2);
    (this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).asyncIteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).asyncGeneratorPrototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    pDVar8 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).asyncIteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                               ::defaultInstance,false,false);
    pDVar10 = DynamicObject::New(pRVar13,pDVar8);
    pTVar1 = &(this->super_JavascriptLibraryBase).asyncFromSyncIteratorProtototype;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->super_JavascriptLibraryBase).asyncFromSyncIteratorProtototype.ptr = pDVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  }
  return;
}

Assistant:

void JavascriptLibrary::InitializePrototypes()
    {
        Recycler* recycler = this->GetRecycler();

        // Recycler macros below expect that their arguments will not throw when they're evaluated.
        // We allocate a lot of types for the built-in prototype objects which we need to store temporarily.
        DynamicType* tempDynamicType = nullptr;
        Type* tempType = StaticType::New(scriptContext, TypeIds_Null, nullptr, nullptr);
        nullValue = RecyclerNew(recycler, RecyclableObject, tempType);
        nullValue->GetType()->SetHasSpecialPrototype(true);
        this->rootPath = TypePath::New(recycler);

        // The prototype property of the object prototype is null.
        objectPrototype = ObjectPrototypeObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, nullValue, nullptr,
            DeferredTypeHandler<InitializeObjectPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        constructorPrototypeObjectType = DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
            &SharedPrototypeTypeHandler, true, true);

        constructorPrototypeObjectType->SetHasNoEnumerableProperties(true);

        arrayBufferPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        if (scriptContext->GetConfig()->IsESSharedArrayBufferEnabled())
        {
            sharedArrayBufferPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeSharedArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            sharedArrayBufferPrototype = nullptr;
        }

        dataViewPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDataViewPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        typedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeTypedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        // If ES6 TypedArrays are enabled, we have Khronos Interop mode enabled
        Uint8ClampedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ClampedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        BoolArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeBoolArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        CharArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeCharArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        arrayPrototype = JavascriptArray::New<Var, JavascriptArray, 0>(0,
            DynamicType::New(scriptContext, TypeIds_Array, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()), recycler);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_BooleanObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeBooleanPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        booleanPrototype = RecyclerNew(recycler, JavascriptBooleanObject, nullptr, tempDynamicType);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_NumberObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeNumberPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        numberPrototype = RecyclerNew(recycler, JavascriptNumberObject, TaggedInt::ToVarUnchecked(0), tempDynamicType);

        bigintPrototype = nullptr;
        if (scriptContext->GetConfig()->IsESBigIntEnabled())
        {
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_BigIntObject, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeBigIntPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            bigintPrototype = RecyclerNew(recycler, JavascriptBigIntObject, nullptr, tempDynamicType);
        }

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_StringObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeStringPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        stringPrototype = RecyclerNew(recycler, JavascriptStringObject, nullptr, tempDynamicType);

        if (scriptContext->GetConfig()->IsES6PrototypeChain())
        {
            datePrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            regexPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeRegexPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            errorPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            double initDateValue = JavascriptNumber::NaN;

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Date, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            datePrototype = RecyclerNewZ(recycler, JavascriptDate, initDateValue, tempDynamicType);

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            errorPrototype = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE);
        }

#define INIT_ERROR_PROTO(field, initFunc) \
        if (scriptContext->GetConfig()->IsES6PrototypeChain()) \
        { \
            field = DynamicObject::New(recycler, \
                DynamicType::New(scriptContext, TypeIds_Object, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance())); \
        } \
        else \
        { \
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance()); \
            field = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE); \
        }